

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::InternReadFile
          (LWOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_03;
  list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *plVar1;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_04;
  undefined8 *puVar2;
  float fVar3;
  value_type vVar4;
  const_iterator mesh_00;
  bool bVar5;
  uint uVar6;
  IOStream *__p;
  pointer pIVar7;
  DeadlyImportError *pDVar8;
  reference pvVar9;
  reference pvVar10;
  Logger *pLVar11;
  pointer pLVar12;
  long lVar13;
  size_type sVar14;
  size_type sVar15;
  uint *puVar16;
  aiNode *layer_00;
  reference pFVar17;
  reference pvVar18;
  reference pvVar19;
  aiMesh *this_05;
  reference pvVar20;
  ulong uVar21;
  ulong *puVar22;
  aiVector3t<float> *paVar23;
  aiColor4t<float> *paVar24;
  char *pcVar25;
  reference puVar26;
  reference puVar27;
  reference pvVar28;
  reference pvVar29;
  reference pvVar30;
  reference pvVar31;
  aiNode *paVar32;
  mapped_type *ppaVar33;
  aiMaterial **ppaVar34;
  aiMaterial *this_06;
  reference pvVar35;
  aiMesh **ppaVar36;
  reference __src;
  aiColor4t<float> *local_9c8;
  aiVector3t<float> *local_9a0;
  aiVector3t<float> *local_978;
  aiFace *local_950;
  aiFace *local_920;
  aiMaterial *pcMat;
  uint mat;
  uint local_78c;
  aiNode *paStack_788;
  uint p_2;
  aiNode *pcNode;
  uint **ppuStack_778;
  uint num;
  uint **p_1;
  reference pvStack_768;
  uint w_1;
  aiVector2D *src;
  aiVector3D **pp;
  uint local_750;
  uint w;
  uint idx_1;
  uint q;
  Face *face;
  uint *local_738;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_730;
  iterator outIt;
  uint vert;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_718;
  const_iterator local_710;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_708;
  const_iterator local_700;
  char *local_6f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *smoothingGroups;
  uint mui_3;
  aiColor4D *pvVC [8];
  uint local_69c;
  uint mui_2;
  aiVector3D *pvUV [8];
  uint local_650;
  uint local_64c;
  uint mui_1;
  uint mui;
  uint vVColorIndices [8];
  uint vUVChannelIndices [8];
  aiFace *pf;
  aiVector3D *pv;
  aiVector3D *nrm;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5e8;
  const_iterator end_1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_5d8;
  const_iterator it_1;
  aiMesh *mesh;
  SortedRep *sorted;
  uint i_1;
  uint p;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_5b0;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_5a8;
  const_iterator local_5a0;
  reference local_598;
  Surface *surf;
  uint local_444;
  iterator iStack_440;
  uint idx;
  iterator end;
  iterator it;
  uint i;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  pSorted;
  uint meshStart;
  Layer *layer;
  iterator __end1;
  iterator __begin1;
  LayerList *__range1;
  uint local_3e0;
  uint iDefaultSurface;
  undefined1 local_3d8 [8];
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  apcNodes;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> apcMeshes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_362;
  allocator<char> local_361;
  string local_360;
  _Self local_340;
  _Self local_338;
  iterator itLayers;
  uint layerCount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  char local_2e5;
  undefined1 local_2e4;
  undefined1 local_2e3;
  undefined1 local_2e2;
  undefined1 local_2e1;
  undefined1 local_2e0 [3];
  char szBuff [5];
  undefined1 local_188 [8];
  TagMappingTable _mMapping;
  TagList _mTags;
  SurfaceList _mSurfaces;
  LayerList _mLayers;
  string local_120;
  char *local_100;
  char *sz;
  uint32_t fileType;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer;
  string local_d0;
  undefined1 local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  LWOImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar7 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar7 == (pointer)0x0) {
    local_a9 = 1;
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open LWO file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar8,&local_88);
    local_a9 = 0;
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar7 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  uVar6 = (*pIVar7->_vptr_IOStream[6])();
  this->fileSize = uVar6;
  if (uVar6 < 0xc) {
    mBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"LWO: The file is too small to contain the IFF header",
               (allocator<char> *)
               ((long)&mBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    DeadlyImportError::DeadlyImportError(pDVar8,&local_d0);
    mBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  uVar6 = this->fileSize;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&sz + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fileType,(ulong)uVar6,
             (allocator<unsigned_char> *)((long)&sz + 7));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&sz + 7));
  pIVar7 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fileType,0);
  (*pIVar7->_vptr_IOStream[2])(pIVar7,pvVar9,1,(ulong)this->fileSize);
  this->pScene = pScene;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fileType,0);
  local_100 = IFF::ReadHeader(pvVar9,(uint32_t *)&sz);
  if (local_100 != (char *)0x0) {
    _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl.
    _M_node._M_size._6_1_ = 1;
    pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    pcVar25 = local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,pcVar25,
               (allocator<char> *)
               ((long)&_mLayers.
                       super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>.
                       _M_impl._M_node._M_size + 7));
    DeadlyImportError::DeadlyImportError(pDVar8,&local_120);
    _mLayers.super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>._M_impl.
    _M_node._M_size._6_1_ = 0;
    __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fileType,0);
  this->mFileBuffer = pvVar9 + 0xc;
  this->fileSize = this->fileSize - 0xc;
  this->hasNamedLayer = false;
  this_00 = &_mSurfaces.
             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::list
            ((list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)this_00);
  this_01 = &_mTags.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::vector
            ((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *)this_01);
  this_02 = &_mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_02);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
  this->mLayers = (LayerList *)this_00;
  this->mTags = (TagList *)this_02;
  this->mMapping = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188;
  this->mSurfaces = (SurfaceList *)this_01;
  plVar1 = this->mLayers;
  LWO::Layer::Layer((Layer *)local_2e0);
  std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::push_back
            (plVar1,(value_type *)local_2e0);
  LWO::Layer::~Layer((Layer *)local_2e0);
  pvVar10 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::back
                      (this->mLayers);
  this->mCurLayer = pvVar10;
  std::__cxx11::string::operator=((string *)&this->mCurLayer->mName,"<LWODefault>");
  this->mCurLayer->mIndex = 0xffff;
  if ((int)sz == 0x4c574f42) {
    pLVar11 = DefaultLogger::get();
    Logger::info(pLVar11,"LWO file format: LWOB (<= LightWave 5.5)");
    this->mIsLWO2 = false;
    this->mIsLXOB = false;
    LoadLWOBFile(this);
  }
  else if ((int)sz == 0x4c574f32) {
    this->mIsLXOB = false;
    pLVar11 = DefaultLogger::get();
    Logger::info(pLVar11,"LWO file format: LWO2 (>= LightWave 6)");
  }
  else {
    if ((int)sz != 0x4c584f42) {
      local_2e5 = sz._3_1_;
      local_2e4 = sz._2_1_;
      local_2e3 = sz._1_1_;
      local_2e2 = sz._0_1_;
      local_2e1 = 0;
      itLayers._M_node._6_1_ = 1;
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&layerCount,"Unknown LWO sub format: ",
                 (allocator<char> *)((long)&itLayers._M_node + 7));
      std::operator+(&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &layerCount,&local_2e5);
      DeadlyImportError::DeadlyImportError(pDVar8,&local_308);
      itLayers._M_node._6_1_ = 0;
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this->mIsLXOB = true;
    pLVar11 = DefaultLogger::get();
    Logger::info(pLVar11,"LWO file format: LXOB (Modo)");
  }
  if ((int)sz != 0x4c574f42) {
    this->mIsLWO2 = true;
    LoadLWO2File(this);
    if (this->configLayerIndex != 0xffffffff) {
      itLayers._M_node._0_4_ = 0;
      local_338._M_node =
           (_List_node_base *)
           std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::begin
                     (this->mLayers);
      while( true ) {
        local_340._M_node =
             (_List_node_base *)
             std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::end
                       (this->mLayers);
        bVar5 = std::operator!=(&local_338,&local_340);
        if (!bVar5) break;
        pLVar12 = std::_List_iterator<Assimp::LWO::Layer>::operator->(&local_338);
        if ((pLVar12->skip & 1U) == 0) {
          itLayers._M_node._0_4_ = (int)itLayers._M_node + 1;
        }
        std::_List_iterator<Assimp::LWO::Layer>::operator++(&local_338);
      }
      if ((int)itLayers._M_node != 2) {
        local_362 = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_360,"LWO2: The requested layer was not found",&local_361);
        DeadlyImportError::DeadlyImportError(pDVar8,&local_360);
        local_362 = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
    }
    lVar13 = std::__cxx11::string::length();
    if ((lVar13 != 0) && ((this->hasNamedLayer & 1U) == 0)) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_388,"LWO2: Unable to find the requested layer: ",&this->configLayerName)
      ;
      DeadlyImportError::DeadlyImportError(pDVar8,&local_388);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  ResolveTags(this);
  ResolveClips(this);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
             &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  ::map((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
         *)local_3d8);
  sVar14 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::size
                     (this->mLayers);
  sVar15 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::size
                     (this->mSurfaces);
  iDefaultSurface = (uint)(sVar15 >> 1) & 0x7fffffff;
  local_3e0 = 1;
  puVar16 = std::min<unsigned_int>(&iDefaultSurface,&local_3e0);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
             &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count,sVar14 * *puVar16);
  __range1._4_4_ = 0xffffffff;
  plVar1 = this->mLayers;
  __end1 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::begin
                     (plVar1);
  layer = (Layer *)std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::end
                             (plVar1);
  do {
    bVar5 = std::operator!=(&__end1,(_Self *)&layer);
    if (!bVar5) {
      bVar5 = std::
              map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
              ::empty((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                       *)local_3d8);
      if ((!bVar5) &&
         (bVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                             &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count), !bVar5)) {
        sVar14 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::size
                           (this->mSurfaces);
        pScene->mNumMaterials = (uint)sVar14;
        ppaVar34 = (aiMaterial **)operator_new__((sVar14 & 0xffffffff) << 3);
        pScene->mMaterials = ppaVar34;
        for (pcMat._0_4_ = 0; (uint)pcMat < pScene->mNumMaterials; pcMat._0_4_ = (uint)pcMat + 1) {
          this_06 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_06);
          pScene->mMaterials[(uint)pcMat] = this_06;
          pvVar35 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                    operator[](this->mSurfaces,(ulong)(uint)pcMat);
          ConvertMaterial(this,pvVar35,this_06);
        }
        sVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                           ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                            &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pScene->mNumMeshes = (uint)sVar14;
        ppaVar36 = (aiMesh **)operator_new__((sVar14 & 0xffffffff) << 3);
        pScene->mMeshes = ppaVar36;
        ppaVar36 = pScene->mMeshes;
        __src = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                           &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
        memcpy(ppaVar36,__src,(ulong)pScene->mNumMeshes << 3);
        GenerateNodeGraph(this,(map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                                *)local_3d8);
        std::
        map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
        ::~map((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                *)local_3d8);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&_mMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::~vector
                  ((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *)
                   &_mTags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::~list
                  ((list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *)
                   &_mSurfaces.
                    super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&fileType);
        std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                  (&local_30);
        return;
      }
      pcMat._6_1_ = 1;
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&mat,"LWO: No meshes loaded",(allocator<char> *)((long)&pcMat + 7));
      DeadlyImportError::DeadlyImportError(pDVar8,(string *)&mat);
      pcMat._6_1_ = 0;
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    layer_00 = (aiNode *)std::_List_iterator<Assimp::LWO::Layer>::operator*(&__end1);
    if (((layer_00->mName).data[0x150] & 1U) == 0) {
      sVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                          &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pSorted.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar14;
      bVar5 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::empty
                        ((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                         ((layer_00->mName).data + 0xfc));
      if ((!bVar5) &&
         (bVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             layer_00), !bVar5)) {
        sVar14 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::size
                           (this->mSurfaces);
        this_03 = (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  ((long)&it._M_current + 7);
        std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
                  (this_03);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&i,sVar14 + 1,this_03);
        std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
                  ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   ((long)&it._M_current + 7));
        it._M_current._0_4_ = 0;
        end = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::begin
                        ((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                         ((layer_00->mName).data + 0xfc));
        iStack_440 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::end
                               ((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                                ((layer_00->mName).data + 0xfc));
        while (bVar5 = __gnu_cxx::operator!=(&end,&stack0xfffffffffffffbc0), bVar5) {
          pFVar17 = __gnu_cxx::
                    __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                    ::operator*(&end);
          if ((((pFVar17->type == 0x46414345) ||
               (pFVar17 = __gnu_cxx::
                          __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                          ::operator*(&end), pFVar17->type == 0x50544348)) ||
              (pFVar17 = __gnu_cxx::
                         __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                         ::operator*(&end), pFVar17->type == 0x424f4e45)) ||
             (pFVar17 = __gnu_cxx::
                        __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                        ::operator*(&end), pFVar17->type == 0x53554244)) {
            pFVar17 = __gnu_cxx::
                      __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
                      ::operator*(&end);
            local_444 = pFVar17->surfaceIndex;
            uVar21 = (ulong)local_444;
            sVar14 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(this->mTags);
            if (sVar14 <= uVar21) {
              pLVar11 = DefaultLogger::get();
              Logger::warn(pLVar11,"LWO: Invalid face surface index");
              local_444 = 0xffffffff;
            }
            if (local_444 == 0xffffffff) {
LAB_0052cb44:
              if (__range1._4_4_ == 0xffffffff) {
                sVar14 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                         size(this->mSurfaces);
                __range1._4_4_ = (uint)sVar14;
                this_04 = this->mSurfaces;
                LWO::Surface::Surface((Surface *)&surf);
                std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::push_back
                          (this_04,(value_type *)&surf);
                LWO::Surface::~Surface((Surface *)&surf);
                local_598 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                            ::back(this->mSurfaces);
                (local_598->mColor).b = 0.6;
                (local_598->mColor).g = 0.6;
                (local_598->mColor).r = 0.6;
                std::__cxx11::string::operator=((string *)local_598,"LWODefaultSurface");
              }
              local_444 = __range1._4_4_;
            }
            else {
              pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                                   (ulong)local_444);
              local_444 = *pvVar18;
              if (local_444 == 0xffffffff) goto LAB_0052cb44;
            }
            pvVar19 = std::
                      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)&i,(ulong)local_444);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (pvVar19,(value_type_conflict2 *)&it);
          }
          __gnu_cxx::
          __normal_iterator<Assimp::LWO::Face_*,_std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>_>
          ::operator++(&end);
          it._M_current._0_4_ = (int)it._M_current + 1;
        }
        if (__range1._4_4_ == 0xffffffff) {
          local_5b0._M_current =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)&i);
          local_5a8 = __gnu_cxx::
                      __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator-(&local_5b0,1);
          __gnu_cxx::
          __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
          ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                    ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                      *)&local_5a0,&local_5a8);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::erase((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&i,local_5a0);
        }
        for (sorted._0_4_ = 0;
            sVar14 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::size
                               (this->mSurfaces), (uint)sorted < sVar14;
            sorted._0_4_ = (uint)sorted + 1) {
          pvVar19 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)&i,(ulong)(uint)sorted);
          bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar19);
          if (!bVar5) {
            this_05 = (aiMesh *)operator_new(0x520);
            aiMesh::aiMesh(this_05);
            it_1._M_current = (uint *)this_05;
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                       &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (value_type *)&it_1);
            sVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar19);
            it_1._M_current[2] = (uint)sVar14;
            end_1._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar19);
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_5d8,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&end_1);
            nrm = (aiVector3D *)
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar19);
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_5e8,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&nrm);
            while (bVar5 = __gnu_cxx::operator!=(&local_5d8,&local_5e8), bVar5) {
              puVar26 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&local_5d8);
              pvVar20 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::
                        operator[]((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                                   ((layer_00->mName).data + 0xfc),(ulong)*puVar26);
              it_1._M_current[1] = (pvVar20->super_aiFace).mNumIndices + it_1._M_current[1];
              __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&local_5d8);
            }
            pv = (aiVector3D *)0x0;
            uVar21 = (ulong)it_1._M_current[1];
            pf = (aiFace *)operator_new__(uVar21 * 0xc);
            if (uVar21 != 0) {
              local_920 = pf;
              do {
                aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_920);
                local_920 = (aiFace *)((long)&local_920->mIndices + 4);
              } while (local_920 != (aiFace *)(&pf->mNumIndices + uVar21 * 3));
            }
            *(aiFace **)(it_1._M_current + 4) = pf;
            uVar21 = (ulong)it_1._M_current[2];
            puVar22 = (ulong *)operator_new__(uVar21 << 4 | 8);
            *puVar22 = uVar21;
            vUVChannelIndices._24_8_ = puVar22 + 1;
            if (uVar21 != 0) {
              local_950 = (aiFace *)vUVChannelIndices._24_8_;
              do {
                aiFace::aiFace(local_950);
                local_950 = local_950 + 1;
              } while (local_950 != (aiFace *)(vUVChannelIndices._24_8_ + uVar21 * 0x10));
            }
            *(undefined8 *)(it_1._M_current + 0x34) = vUVChannelIndices._24_8_;
            it_1._M_current[0x3a] = (uint)sorted;
            for (local_64c = 0; local_64c < 8; local_64c = local_64c + 1) {
              vVColorIndices[(ulong)local_64c + 6] = 0xffffffff;
            }
            for (local_650 = 0; local_650 < 8; local_650 = local_650 + 1) {
              (&mui_1)[local_650] = 0xffffffff;
            }
            pvVar35 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                      operator[]((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                  *)&_mTags.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)(uint)sorted);
            FindUVChannels(this,pvVar35,pvVar19,(Layer *)layer_00,vVColorIndices + 6);
            pvVar35 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                      operator[]((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                  *)&_mTags.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)(uint)sorted);
            FindVCChannels(this,pvVar35,pvVar19,(Layer *)layer_00,&mui_1);
            local_69c = 0;
            while ((local_69c < 8 && (vVColorIndices[(ulong)local_69c + 6] != 0xffffffff))) {
              uVar21 = (ulong)it_1._M_current[1];
              paVar23 = (aiVector3t<float> *)operator_new__(uVar21 * 0xc);
              if (uVar21 != 0) {
                local_978 = paVar23;
                do {
                  aiVector3t<float>::aiVector3t(local_978);
                  local_978 = local_978 + 1;
                } while (local_978 != paVar23 + uVar21);
              }
              *(aiVector3t<float> **)(it_1._M_current + (ulong)local_69c * 2 + 0x1c) = paVar23;
              *(aiVector3t<float> **)(&stack0xfffffffffffff968 + (ulong)local_69c * 8) = paVar23;
              it_1._M_current[0x2c] = 2;
              local_69c = local_69c + 1;
            }
            lVar13 = std::__cxx11::string::length();
            if (lVar13 != 0) {
              uVar21 = (ulong)it_1._M_current[1];
              pv = (aiVector3D *)operator_new__(uVar21 * 0xc);
              if (uVar21 != 0) {
                local_9a0 = pv;
                do {
                  aiVector3t<float>::aiVector3t(local_9a0);
                  local_9a0 = local_9a0 + 1;
                } while (local_9a0 != pv + uVar21);
              }
              *(aiVector3D **)(it_1._M_current + 6) = pv;
            }
            for (smoothingGroups._4_4_ = 0;
                (smoothingGroups._4_4_ < 8 && ((&mui_1)[smoothingGroups._4_4_] != 0xffffffff));
                smoothingGroups._4_4_ = smoothingGroups._4_4_ + 1) {
              uVar21 = (ulong)it_1._M_current[1];
              paVar24 = (aiColor4t<float> *)operator_new__(uVar21 << 4);
              if (uVar21 != 0) {
                local_9c8 = paVar24;
                do {
                  aiColor4t<float>::aiColor4t(local_9c8);
                  local_9c8 = local_9c8 + 1;
                } while (local_9c8 != paVar24 + uVar21);
              }
              *(aiColor4t<float> **)(it_1._M_current + (ulong)smoothingGroups._4_4_ * 2 + 0xc) =
                   paVar24;
              *(aiColor4t<float> **)(&stack0xfffffffffffff918 + (ulong)smoothingGroups._4_4_ * 8) =
                   paVar24;
            }
            pcVar25 = (layer_00->mName).data + 0x14;
            local_6f8 = pcVar25;
            local_708._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pcVar25);
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_700,&local_708);
            local_718._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6f8
                                   );
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_710,&local_718);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pcVar25,local_700,
                       local_710);
            outIt._M_current._4_4_ = 0;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6f8,
                       (ulong)it_1._M_current[2],
                       (value_type_conflict2 *)((long)&outIt._M_current + 4));
            outIt._M_current._0_4_ = 0;
            local_730._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_6f8
                                   );
            face = (Face *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar19);
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_738,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&face);
            local_5d8._M_current = local_738;
            while (bVar5 = __gnu_cxx::operator!=(&local_5d8,&local_5e8), mesh_00 = it_1,
                  pcVar25 = local_6f8, bVar5) {
              puVar26 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&local_5d8);
              _idx_1 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::
                       operator[]((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                                  ((layer_00->mName).data + 0xfc),(ulong)*puVar26);
              uVar6 = _idx_1->smoothGroup;
              puVar27 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&local_730);
              *puVar27 = uVar6;
              for (w = 0; w < (_idx_1->super_aiFace).mNumIndices; w = w + 1) {
                local_750 = (_idx_1->super_aiFace).mIndices[w];
                pvVar28 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)layer_00,(ulong)local_750);
                fVar3 = pvVar28->y;
                pf->mNumIndices = (uint)pvVar28->x;
                *(float *)&pf->field_0x4 = fVar3;
                *(float *)&pf->mIndices = pvVar28->z;
                pp._4_4_ = 0;
                while ((pp._4_4_ < 8 && (vVColorIndices[(ulong)pp._4_4_ + 6] != 0xffffffff))) {
                  src = (aiVector2D *)(&stack0xfffffffffffff968 + (ulong)pp._4_4_ * 8);
                  pvVar29 = std::
                            vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                            ::operator[]((vector<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                          *)((layer_00->mName).data + 0x74),
                                         (ulong)vVColorIndices[(ulong)pp._4_4_ + 6]);
                  pvStack_768 = std::vector<float,_std::allocator<float>_>::operator[]
                                          (&(pvVar29->super_VMapEntry).rawData,0);
                  pvStack_768 = pvStack_768 + (ulong)local_750 * 2;
                  *(value_type *)*src = *pvStack_768;
                  *(value_type *)((long)*src + 4) = pvStack_768[1];
                  *src = (aiVector2D)((long)*src + 0xc);
                  pp._4_4_ = pp._4_4_ + 1;
                }
                if (pv != (aiVector3D *)0x0) {
                  pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)
                                       ((layer_00->mName).data + 0xbc),0);
                  pvVar30 = pvVar30 + (ulong)local_750 * 3;
                  vVar4 = pvVar30[1];
                  pv->x = pvVar30[0];
                  pv->y = vVar4;
                  pv->z = pvVar30[2];
                  pv->z = pv->z * -1.0;
                  pv = pv + 1;
                }
                for (p_1._4_4_ = 0; (p_1._4_4_ < 8 && ((&mui_1)[p_1._4_4_] != 0xffffffff));
                    p_1._4_4_ = p_1._4_4_ + 1) {
                  pvVar31 = std::
                            vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                            ::operator[]((vector<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                          *)((layer_00->mName).data + 0x5c),
                                         (ulong)(&mui_1)[p_1._4_4_]);
                  pvVar30 = std::vector<float,_std::allocator<float>_>::operator[]
                                      (&(pvVar31->super_VMapEntry).rawData,0);
                  puVar2 = *(undefined8 **)(&stack0xfffffffffffff918 + (ulong)p_1._4_4_ * 8);
                  *puVar2 = *(undefined8 *)(pvVar30 + (ulong)local_750 * 4);
                  puVar2[1] = *(undefined8 *)(pvVar30 + (ulong)local_750 * 4 + 2);
                  pvVar35 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                            ::operator[]((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                          *)&_mTags.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (ulong)(uint)sorted);
                  if (pvVar35->mVCMapType == 0x52474220) {
                    *(undefined4 *)
                     (*(long *)(&stack0xfffffffffffff918 + (ulong)p_1._4_4_ * 8) + 0xc) = 0x3f800000
                    ;
                  }
                  *(long *)(&stack0xfffffffffffff918 + (ulong)p_1._4_4_ * 8) =
                       *(long *)(&stack0xfffffffffffff918 + (ulong)p_1._4_4_ * 8) + 0x10;
                }
                (_idx_1->super_aiFace).mIndices[w] = (uint)outIt._M_current;
                outIt._M_current._0_4_ = (uint)outIt._M_current + 1;
                pf = (aiFace *)((long)&pf->mIndices + 4);
              }
              *(uint **)(vUVChannelIndices._24_8_ + 8) = (_idx_1->super_aiFace).mIndices;
              *(uint *)vUVChannelIndices._24_8_ = (_idx_1->super_aiFace).mNumIndices;
              ppuStack_778 = &(_idx_1->super_aiFace).mIndices;
              *ppuStack_778 = (uint *)0x0;
              vUVChannelIndices._24_8_ = vUVChannelIndices._24_8_ + 0x10;
              __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&local_5d8);
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&local_730);
            }
            if (*(long *)(it_1._M_current + 6) == 0) {
              pvVar35 = std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
                        operator[]((vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                                    *)&_mTags.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (ulong)(uint)sorted);
              ComputeNormals(this,(aiMesh *)mesh_00._M_current,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pcVar25,pvVar35)
              ;
            }
            else {
              pLVar11 = DefaultLogger::get();
              Logger::debug(pLVar11,"LWO2: No need to compute normals, they\'re already there");
            }
          }
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&i);
      }
      sVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                          &apcNodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pcNode._4_4_ = (int)sVar14 -
                     pSorted.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((layer_00->mName).data + 0x124),"<LWODefault>");
      if ((bVar5) || (pcNode._4_4_ != 0)) {
        paVar32 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar32);
        paStack_788 = paVar32;
        aiString::Set((aiString *)paVar32,(string *)((layer_00->mName).data + 0x124));
        paStack_788->mParent = layer_00;
        paStack_788->mNumMeshes = pcNode._4_4_;
        if (paStack_788->mNumMeshes != 0) {
          puVar16 = (uint *)operator_new__((ulong)paStack_788->mNumMeshes << 2);
          paStack_788->mMeshes = puVar16;
          for (local_78c = 0; local_78c < paStack_788->mNumMeshes; local_78c = local_78c + 1) {
            paStack_788->mMeshes[local_78c] =
                 local_78c +
                 pSorted.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          }
        }
        paVar32 = paStack_788;
        ppaVar33 = std::
                   map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                   ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                                 *)local_3d8,(key_type_conflict2 *)((layer_00->mName).data + 0x11e))
        ;
        *ppaVar33 = paVar32;
      }
    }
    std::_List_iterator<Assimp::LWO::Layer>::operator++(&__end1);
  } while( true );
}

Assistant:

void LWOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene,
    IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open LWO file " + pFile + ".");

    if((this->fileSize = (unsigned int)file->FileSize()) < 12)
        throw DeadlyImportError("LWO: The file is too small to contain the IFF header");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< uint8_t > mBuffer(fileSize);
    file->Read( &mBuffer[0], 1, fileSize);
    this->pScene = pScene;

    // Determine the type of the file
    uint32_t fileType;
    const char* sz = IFF::ReadHeader(&mBuffer[0],fileType);
    if (sz)throw DeadlyImportError(sz);

    mFileBuffer = &mBuffer[0] + 12;
    fileSize -= 12;

    // Initialize some members with their default values
    hasNamedLayer   = false;

    // Create temporary storage on the stack but store pointers to it in the class
    // instance. Therefore everything will be destructed properly if an exception
    // is thrown and we needn't take care of that.
    LayerList       _mLayers;
    SurfaceList     _mSurfaces;
    TagList         _mTags;
    TagMappingTable _mMapping;

    mLayers         = &_mLayers;
    mTags           = &_mTags;
    mMapping        = &_mMapping;
    mSurfaces       = &_mSurfaces;

    // Allocate a default layer (layer indices are 1-based from now)
    mLayers->push_back(Layer());
    mCurLayer = &mLayers->back();
    mCurLayer->mName = "<LWODefault>";
    mCurLayer->mIndex = -1;

    // old lightwave file format (prior to v6)
    if (AI_LWO_FOURCC_LWOB == fileType) {
        ASSIMP_LOG_INFO("LWO file format: LWOB (<= LightWave 5.5)");

        mIsLWO2 = false;
        mIsLXOB = false;
        LoadLWOBFile();
    }
    // New lightwave format
    else if (AI_LWO_FOURCC_LWO2 == fileType)    {
        mIsLXOB = false;
        ASSIMP_LOG_INFO("LWO file format: LWO2 (>= LightWave 6)");
    }
    // MODO file format
    else if (AI_LWO_FOURCC_LXOB == fileType)    {
        mIsLXOB = true;
        ASSIMP_LOG_INFO("LWO file format: LXOB (Modo)");
    }
    // we don't know this format
    else
    {
        char szBuff[5];
        szBuff[0] = (char)(fileType >> 24u);
        szBuff[1] = (char)(fileType >> 16u);
        szBuff[2] = (char)(fileType >> 8u);
        szBuff[3] = (char)(fileType);
        szBuff[4] = '\0';
        throw DeadlyImportError(std::string("Unknown LWO sub format: ") + szBuff);
    }

    if (AI_LWO_FOURCC_LWOB != fileType) {
        mIsLWO2 = true;
        LoadLWO2File();

        // The newer lightwave format allows the user to configure the
        // loader that just one layer is used. If this is the case
        // we need to check now whether the requested layer has been found.
        if (UINT_MAX != configLayerIndex) {
            unsigned int layerCount = 0;
            for(std::list<LWO::Layer>::iterator itLayers=mLayers->begin(); itLayers!=mLayers->end(); ++itLayers)
                if (!itLayers->skip)
                    layerCount++;
            if (layerCount!=2)
                throw DeadlyImportError("LWO2: The requested layer was not found");
        }

        if (configLayerName.length() && !hasNamedLayer) {
            throw DeadlyImportError("LWO2: Unable to find the requested layer: "
                + configLayerName);
        }
    }

    // now, as we have loaded all data, we can resolve cross-referenced tags and clips
    ResolveTags();
    ResolveClips();

    // now process all layers and build meshes and nodes
    std::vector<aiMesh*> apcMeshes;
    std::map<uint16_t, aiNode*> apcNodes;

    apcMeshes.reserve(mLayers->size()*std::min(((unsigned int)mSurfaces->size()/2u), 1u));

    unsigned int iDefaultSurface = UINT_MAX; // index of the default surface
	for (LWO::Layer &layer : *mLayers) {
        if (layer.skip)
            continue;

        // I don't know whether there could be dummy layers, but it would be possible
        const unsigned int meshStart = (unsigned int)apcMeshes.size();
        if (!layer.mFaces.empty() && !layer.mTempPoints.empty())    {

            // now sort all faces by the surfaces assigned to them
            std::vector<SortedRep> pSorted(mSurfaces->size()+1);

            unsigned int i = 0;
            for (FaceList::iterator it = layer.mFaces.begin(), end = layer.mFaces.end();it != end;++it,++i) {
                // Check whether we support this face's type
                if ((*it).type != AI_LWO_FACE && (*it).type != AI_LWO_PTCH &&
                    (*it).type != AI_LWO_BONE && (*it).type != AI_LWO_SUBD) {
                    continue;
                }

                unsigned int idx = (*it).surfaceIndex;
                if (idx >= mTags->size())
                {
                    ASSIMP_LOG_WARN("LWO: Invalid face surface index");
                    idx = UINT_MAX;
                }
                if(UINT_MAX == idx || UINT_MAX == (idx = _mMapping[idx]))   {
                    if (UINT_MAX == iDefaultSurface)    {
                        iDefaultSurface = (unsigned int)mSurfaces->size();
                        mSurfaces->push_back(LWO::Surface());
                        LWO::Surface& surf = mSurfaces->back();
                        surf.mColor.r = surf.mColor.g = surf.mColor.b = 0.6f;
                        surf.mName = "LWODefaultSurface";
                    }
                    idx = iDefaultSurface;
                }
                pSorted[idx].push_back(i);
            }
            if (UINT_MAX == iDefaultSurface) {
                pSorted.erase(pSorted.end()-1);
            }
            for (unsigned int p = 0,i = 0;i < mSurfaces->size();++i)    {
                SortedRep& sorted = pSorted[i];
                if (sorted.empty())
                    continue;

                // generate the mesh
                aiMesh* mesh = new aiMesh();
                apcMeshes.push_back(mesh);
                mesh->mNumFaces = (unsigned int)sorted.size();

                // count the number of vertices
                SortedRep::const_iterator it = sorted.begin(), end = sorted.end();
                for (;it != end;++it)   {
                    mesh->mNumVertices += layer.mFaces[*it].mNumIndices;
                }

                aiVector3D *nrm = NULL, * pv = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                aiFace* pf = mesh->mFaces = new aiFace[mesh->mNumFaces];
                mesh->mMaterialIndex = i;

                // find out which vertex color channels and which texture coordinate
                // channels are really required by the material attached to this mesh
                unsigned int vUVChannelIndices[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                unsigned int vVColorIndices[AI_MAX_NUMBER_OF_COLOR_SETS];

#ifdef ASSIMP_BUILD_DEBUG
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    vUVChannelIndices[mui] = UINT_MAX;
                }
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui ) {
                    vVColorIndices[mui] = UINT_MAX;
                }
#endif

                FindUVChannels(_mSurfaces[i],sorted,layer,vUVChannelIndices);
                FindVCChannels(_mSurfaces[i],sorted,layer,vVColorIndices);

                // allocate storage for UV and CV channels
                aiVector3D* pvUV[AI_MAX_NUMBER_OF_TEXTURECOORDS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_TEXTURECOORDS;++mui ) {
                    if (UINT_MAX == vUVChannelIndices[mui]) {
                        break;
                    }

                    pvUV[mui] = mesh->mTextureCoords[mui] = new aiVector3D[mesh->mNumVertices];

                    // LightWave doesn't support more than 2 UV components (?)
                    mesh->mNumUVComponents[0] = 2;
                }

                if (layer.mNormals.name.length())
                    nrm = mesh->mNormals = new aiVector3D[mesh->mNumVertices];

                aiColor4D* pvVC[AI_MAX_NUMBER_OF_COLOR_SETS];
                for (unsigned int mui = 0; mui < AI_MAX_NUMBER_OF_COLOR_SETS;++mui) {
                    if (UINT_MAX == vVColorIndices[mui]) {
                        break;
                    }
                    pvVC[mui] = mesh->mColors[mui] = new aiColor4D[mesh->mNumVertices];
                }

                // we would not need this extra array, but the code is much cleaner if we use it
                std::vector<unsigned int>& smoothingGroups = layer.mPointReferrers;
                smoothingGroups.erase (smoothingGroups.begin(),smoothingGroups.end());
                smoothingGroups.resize(mesh->mNumFaces,0);

                // now convert all faces
                unsigned int vert = 0;
                std::vector<unsigned int>::iterator outIt = smoothingGroups.begin();
                for (it = sorted.begin(); it != end;++it,++outIt)   {
                    const LWO::Face& face = layer.mFaces[*it];
                    *outIt = face.smoothGroup;

                    // copy all vertices
                    for (unsigned int q = 0; q  < face.mNumIndices;++q,++vert)  {
                        unsigned int idx = face.mIndices[q];
                        *pv++ = layer.mTempPoints[idx] /*- layer.mPivot*/;

                        // process UV coordinates
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_TEXTURECOORDS;++w)    {
                            if (UINT_MAX == vUVChannelIndices[w]) {
                                break;
                            }
                            aiVector3D*& pp = pvUV[w];
                            const aiVector2D& src = ((aiVector2D*)&layer.mUVChannels[vUVChannelIndices[w]].rawData[0])[idx];
                            pp->x = src.x;
                            pp->y = src.y;
                            pp++;
                        }

                        // process normals (MODO extension)
                        if (nrm)    {
                            *nrm = ((aiVector3D*)&layer.mNormals.rawData[0])[idx];
                            nrm->z *= -1.f;
                            ++nrm;
                        }

                        // process vertex colors
                        for (unsigned int w = 0; w < AI_MAX_NUMBER_OF_COLOR_SETS;++w)   {
                            if (UINT_MAX == vVColorIndices[w]) {
                                break;
                            }
                            *pvVC[w] = ((aiColor4D*)&layer.mVColorChannels[vVColorIndices[w]].rawData[0])[idx];

                            // If a RGB color map is explicitly requested delete the
                            // alpha channel - it could theoretically be != 1.
                            if(_mSurfaces[i].mVCMapType == AI_LWO_RGB)
                                pvVC[w]->a = 1.f;

                            pvVC[w]++;
                        }

#if 0
                        // process vertex weights. We can't properly reconstruct the whole skeleton for now,
                        // but we can create dummy bones for all weight channels which we have.
                        for (unsigned int w = 0; w < layer.mWeightChannels.size();++w)
                        {
                        }
#endif

                        face.mIndices[q] = vert;
                    }
                    pf->mIndices = face.mIndices;
                    pf->mNumIndices = face.mNumIndices;
                    unsigned int** p = (unsigned int**)&face.mIndices;*p = NULL; // HACK: make sure it won't be deleted
                    pf++;
                }

                if (!mesh->mNormals)    {
                    // Compute normal vectors for the mesh - we can't use our GenSmoothNormal-
                    // Step here since it wouldn't handle smoothing groups correctly for LWO.
                    // So we use a separate implementation.
                    ComputeNormals(mesh,smoothingGroups,_mSurfaces[i]);
                }
                else {
                    ASSIMP_LOG_DEBUG("LWO2: No need to compute normals, they're already there");
                }
                ++p;
            }
        }

        // Generate nodes to render the mesh. Store the source layer in the mParent member of the nodes
        unsigned int num = static_cast<unsigned int>(apcMeshes.size() - meshStart);
        if (layer.mName != "<LWODefault>" || num > 0) {
            aiNode* pcNode = new aiNode();
            pcNode->mName.Set(layer.mName);
            pcNode->mParent = (aiNode*)&layer;
            pcNode->mNumMeshes = num;

            if (pcNode->mNumMeshes) {
                pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
                for (unsigned int p = 0; p < pcNode->mNumMeshes;++p)
                    pcNode->mMeshes[p] = p + meshStart;
            }
            apcNodes[layer.mIndex] = pcNode;
        }
    }

    if (apcNodes.empty() || apcMeshes.empty())
        throw DeadlyImportError("LWO: No meshes loaded");

    // The RemoveRedundantMaterials step will clean this up later
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials = (unsigned int)mSurfaces->size()];
    for (unsigned int mat = 0; mat < pScene->mNumMaterials;++mat)   {
        aiMaterial* pcMat = new aiMaterial();
        pScene->mMaterials[mat] = pcMat;
        ConvertMaterial((*mSurfaces)[mat],pcMat);
    }

    // copy the meshes to the output structure
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes = (unsigned int)apcMeshes.size() ];
    ::memcpy(pScene->mMeshes,&apcMeshes[0],pScene->mNumMeshes*sizeof(void*));

    // generate the final node graph
    GenerateNodeGraph(apcNodes);
}